

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool __thiscall vkb::SystemInfo::is_extension_available(SystemInfo *this,char *extension_name)

{
  char *extension_name_local;
  SystemInfo *this_local;
  
  if (extension_name == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = detail::check_extension_supported(&this->available_extensions,extension_name)
    ;
  }
  return this_local._7_1_;
}

Assistant:

bool SystemInfo::is_extension_available(const char* extension_name) const {
    if (!extension_name) return false;
    return detail::check_extension_supported(available_extensions, extension_name);
}